

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_ls.c
# Opt level: O3

int IDASetLinearSolver(void *ida_mem,SUNLinearSolver LS,SUNMatrix A)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  code *pcVar4;
  uint *__ptr;
  SUNLinearSolver_Ops p_Var5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  char *pcVar11;
  SUNMatrix p_Var12;
  bool bVar13;
  
  if (ida_mem == (void *)0x0) {
    pcVar11 = "Integrator memory is NULL.";
    iVar9 = -1;
    ida_mem = (IDAMem)0x0;
    iVar10 = -1;
    iVar3 = 0x62;
LAB_00122bc2:
    IDAProcessError((IDAMem)ida_mem,iVar10,iVar3,"IDASetLinearSolver",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_ls.c"
                    ,pcVar11);
    return iVar9;
  }
  if (LS == (SUNLinearSolver)0x0) {
    pcVar11 = "LS must be non-NULL";
    iVar9 = -3;
    ida_mem = (IDAMem)0x0;
    iVar10 = -3;
    iVar3 = 0x68;
    goto LAB_00122bc2;
  }
  if ((LS->ops->gettype == (_func_SUNLinearSolver_Type_SUNLinearSolver *)0x0) ||
     (LS->ops->solve == (_func_int_SUNLinearSolver_SUNMatrix_N_Vector_N_Vector_sunrealtype *)0x0)) {
    pcVar11 = "LS object is missing a required operation";
    iVar9 = -3;
    iVar10 = -3;
    iVar3 = 0x71;
    goto LAB_00122bc2;
  }
  uVar2 = SUNLinSolGetType(LS);
  bVar13 = (uVar2 - 1 & 0xfffffffd) != 0;
  lVar6 = *(long *)(*(long *)((long)ida_mem + 0x2c8) + 8);
  if ((*(long *)(lVar6 + 0x60) == 0) || (*(long *)(lVar6 + 0xa8) == 0)) {
    pcVar11 = "A required vector operation is not implemented.";
    iVar9 = -3;
    iVar10 = -3;
    iVar3 = 0x82;
    goto LAB_00122bc2;
  }
  if (A != (SUNMatrix)0x0 && uVar2 == 3) {
    pcVar11 = "Incompatible inputs: matrix-embedded LS requires NULL matrix";
    iVar9 = -3;
    iVar10 = -3;
    iVar3 = 0x8a;
    goto LAB_00122bc2;
  }
  if (uVar2 == 0) {
    if (A == (SUNMatrix)0x0) {
      pcVar11 = "Incompatible inputs: direct LS requires non-NULL matrix";
      iVar9 = -3;
      iVar10 = -3;
      iVar3 = 0xb4;
      goto LAB_00122bc2;
    }
  }
  else {
    if (*(long *)(lVar6 + 0x48) == 0) {
      pcVar11 = "A required vector operation is not implemented.";
      iVar9 = -3;
      iVar10 = -3;
      iVar3 = 0x94;
      goto LAB_00122bc2;
    }
    if ((uVar2 != 3) &&
       ((LS->ops->resid == (_func_N_Vector_SUNLinearSolver *)0x0 ||
        (LS->ops->numiters == (_func_int_SUNLinearSolver *)0x0)))) {
      pcVar11 = "Iterative LS object requires \'resid\' and \'numiters\' routines";
      iVar9 = -3;
      iVar10 = -3;
      iVar3 = 0x9d;
      goto LAB_00122bc2;
    }
    if (((uVar2 != 3) != bVar13) &&
       (LS->ops->setatimes == (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0)) {
      pcVar11 = "Incompatible inputs: iterative LS must support ATimes routine";
      iVar9 = -3;
      iVar10 = -3;
      iVar3 = 0xa6;
      goto LAB_00122bc2;
    }
    if ((A == (SUNMatrix)0x0) && ((uVar2 | 2) != 3)) {
      pcVar11 = "Incompatible inputs: matrix-iterative LS requires non-NULL matrix";
      iVar9 = -3;
      iVar10 = -3;
      iVar3 = 0xad;
      goto LAB_00122bc2;
    }
  }
  if (*(code **)((long)ida_mem + 0x758) != (code *)0x0) {
    (**(code **)((long)ida_mem + 0x758))(ida_mem);
  }
  *(code **)((long)ida_mem + 0x738) = idaLsInitialize;
  *(code **)((long)ida_mem + 0x740) = idaLsSetup;
  *(code **)((long)ida_mem + 0x748) = idaLsSolve;
  *(code **)((long)ida_mem + 0x758) = idaLsFree;
  if (uVar2 == 0) {
    pcVar4 = (code *)0x0;
  }
  else {
    pcVar4 = idaLsPerf;
  }
  *(code **)((long)ida_mem + 0x750) = pcVar4;
  __ptr = (uint *)calloc(1,0x148);
  if (__ptr == (uint *)0x0) {
    pcVar11 = "A memory request failed.";
    iVar9 = -4;
    iVar10 = -4;
    iVar3 = 0xca;
    goto LAB_00122bc2;
  }
  *(SUNLinearSolver *)(__ptr + 8) = LS;
  *__ptr = (uint)(uVar2 != 0);
  __ptr[1] = (uint)bVar13;
  *(SUNMatrix *)(__ptr + 10) = A;
  bVar13 = A != (SUNMatrix)0x0;
  p_Var12 = A;
  if (bVar13) {
    A = (SUNMatrix)ida_mem;
    p_Var12 = (SUNMatrix)idaLsDQJac;
  }
  __ptr[2] = (uint)bVar13;
  *(SUNMatrix *)(__ptr + 4) = p_Var12;
  *(SUNMatrix *)(__ptr + 6) = A;
  __ptr[0x48] = 1;
  __ptr[0x4a] = 0;
  __ptr[0x4b] = 0;
  *(code **)(__ptr + 0x4c) = idaLsDQJtimes;
  *(undefined8 *)(__ptr + 0x4e) = *(undefined8 *)((long)ida_mem + 0x10);
  *(void **)(__ptr + 0x50) = ida_mem;
  __ptr[0x40] = 0;
  __ptr[0x41] = 0;
  __ptr[0x42] = 0;
  __ptr[0x43] = 0;
  __ptr[0x44] = 0;
  __ptr[0x45] = 0;
  *(undefined8 *)(__ptr + 0x46) = *(undefined8 *)((long)ida_mem + 0x18);
  __ptr[0x20] = 0;
  __ptr[0x21] = 0;
  __ptr[0x22] = 0;
  __ptr[0x23] = 0;
  __ptr[0x24] = 0;
  __ptr[0x25] = 0;
  __ptr[0x26] = 0;
  __ptr[0x27] = 0;
  __ptr[0x28] = 0;
  __ptr[0x29] = 0;
  __ptr[0x2a] = 0;
  __ptr[0x2b] = 0;
  __ptr[0x2c] = 0;
  __ptr[0x2d] = 0;
  __ptr[0x2e] = 0;
  __ptr[0x2f] = 0;
  __ptr[0x1a] = 0x9999999a;
  __ptr[0x1b] = 0x3fa99999;
  __ptr[0x1e] = 0;
  __ptr[0x1f] = 0x3ff00000;
  __ptr[0x3e] = 0;
  p_Var5 = LS->ops;
  if (p_Var5->setatimes == (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0) {
LAB_00122ed7:
    if ((p_Var5->setpreconditioner ==
         (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNPSetupFn_SUNPSolveFn *)0x0) ||
       (iVar3 = SUNLinSolSetPreconditioner(LS,ida_mem,0,0), iVar3 == 0)) {
      lVar6 = N_VClone(*(undefined8 *)((long)ida_mem + 0x2c8));
      *(long *)(__ptr + 0xc) = lVar6;
      if (lVar6 != 0) {
        lVar7 = N_VClone(*(undefined8 *)((long)ida_mem + 0x2c8));
        *(long *)(__ptr + 0xe) = lVar7;
        if (lVar7 == 0) {
          IDAProcessError((IDAMem)ida_mem,-4,0x123,"IDASetLinearSolver",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_ls.c"
                          ,"A memory request failed.");
        }
        else {
          lVar8 = N_VClone(*(undefined8 *)((long)ida_mem + 0x2c8));
          *(long *)(__ptr + 0x10) = lVar8;
          if (lVar8 != 0) {
            if (uVar2 == 0) {
              uVar2 = 1;
            }
            else {
              lVar7 = N_VGetLength(lVar6);
              if (lVar7 < 1) {
                dVar1 = 0.0;
              }
              else {
                lVar6 = N_VGetLength(lVar6);
                dVar1 = (double)lVar6;
                if (dVar1 < 0.0) {
                  dVar1 = sqrt(dVar1);
                }
                else {
                  dVar1 = SQRT(dVar1);
                }
              }
              *(double *)(__ptr + 0x1c) = dVar1;
              uVar2 = (uint)((uVar2 - 1 & 0xfffffffd) != 0);
            }
            __ptr[0x18] = uVar2;
            *(uint **)((long)ida_mem + 0x760) = __ptr;
            return 0;
          }
          IDAProcessError((IDAMem)ida_mem,-4,0x12e,"IDASetLinearSolver",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_ls.c"
                          ,"A memory request failed.");
          N_VDestroy(lVar6);
          lVar6 = lVar7;
        }
        iVar9 = -4;
        N_VDestroy(lVar6);
        goto LAB_00123009;
      }
      pcVar11 = "A memory request failed.";
      iVar9 = -4;
      iVar10 = -4;
      iVar3 = 0x119;
    }
    else {
      pcVar11 = "Error in calling SUNLinSolSetPreconditioner";
      iVar9 = -9;
      iVar10 = -9;
      iVar3 = 0x10d;
    }
  }
  else {
    iVar3 = SUNLinSolSetATimes(LS,ida_mem,idaLsATimes);
    if (iVar3 == 0) {
      p_Var5 = LS->ops;
      goto LAB_00122ed7;
    }
    pcVar11 = "Error in calling SUNLinSolSetATimes";
    iVar9 = -9;
    iVar10 = -9;
    iVar3 = 0xff;
  }
  IDAProcessError((IDAMem)ida_mem,iVar10,iVar3,"IDASetLinearSolver",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_ls.c"
                  ,pcVar11);
LAB_00123009:
  free(__ptr);
  return iVar9;
}

Assistant:

int IDASetLinearSolver(void* ida_mem, SUNLinearSolver LS, SUNMatrix A)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  int retval, LSType;
  sunbooleantype iterative;   /* is the solver iterative?    */
  sunbooleantype matrixbased; /* is a matrix structure used? */

  /* Return immediately if any input is NULL */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDALS_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_LS_IDAMEM_NULL);
    return (IDALS_MEM_NULL);
  }
  if (LS == NULL)
  {
    IDAProcessError(NULL, IDALS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "LS must be non-NULL");
    return (IDALS_ILL_INPUT);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* Test if solver is compatible with LS interface */
  if ((LS->ops->gettype == NULL) || (LS->ops->solve == NULL))
  {
    IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "LS object is missing a required operation");
    return (IDALS_ILL_INPUT);
  }

  /* Retrieve the LS type */
  LSType = SUNLinSolGetType(LS);

  /* Set flags based on LS type */
  iterative   = (LSType != SUNLINEARSOLVER_DIRECT);
  matrixbased = ((LSType != SUNLINEARSOLVER_ITERATIVE) &&
                 (LSType != SUNLINEARSOLVER_MATRIX_EMBEDDED));

  /* Test if vector is compatible with LS interface */
  if (IDA_mem->ida_tempv1->ops->nvconst == NULL ||
      IDA_mem->ida_tempv1->ops->nvwrmsnorm == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_LS_BAD_NVECTOR);
    return (IDALS_ILL_INPUT);
  }

  /* Ensure that A is NULL when LS is matrix-embedded */
  if ((LSType == SUNLINEARSOLVER_MATRIX_EMBEDDED) && (A != NULL))
  {
    IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "Incompatible inputs: matrix-embedded LS requires NULL matrix");
    return (IDALS_ILL_INPUT);
  }

  /* Check for compatible LS type, matrix and "atimes" support */
  if (iterative)
  {
    if (IDA_mem->ida_tempv1->ops->nvgetlength == NULL)
    {
      IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_LS_BAD_NVECTOR);
      return (IDALS_ILL_INPUT);
    }

    if (LSType != SUNLINEARSOLVER_MATRIX_EMBEDDED)
    {
      if (LS->ops->resid == NULL || LS->ops->numiters == NULL)
      {
        IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__,
                        __FILE__, "Iterative LS object requires 'resid' and 'numiters' routines");
        return (IDALS_ILL_INPUT);
      }
    }

    if (!matrixbased && (LSType != SUNLINEARSOLVER_MATRIX_EMBEDDED) &&
        (LS->ops->setatimes == NULL))
    {
      IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__,
                      __FILE__, "Incompatible inputs: iterative LS must support ATimes routine");
      return (IDALS_ILL_INPUT);
    }

    if (matrixbased && (A == NULL))
    {
      IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__,
                      __FILE__, "Incompatible inputs: matrix-iterative LS requires non-NULL matrix");
      return (IDALS_ILL_INPUT);
    }
  }
  else if (A == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Incompatible inputs: direct LS requires non-NULL matrix");
    return (IDALS_ILL_INPUT);
  }

  /* free any existing system solver attached to IDA */
  if (IDA_mem->ida_lfree) { IDA_mem->ida_lfree(IDA_mem); }

  /* Set four main system linear solver function fields in IDA_mem */
  IDA_mem->ida_linit  = idaLsInitialize;
  IDA_mem->ida_lsetup = idaLsSetup;
  IDA_mem->ida_lsolve = idaLsSolve;
  IDA_mem->ida_lfree  = idaLsFree;

  /* Set ida_lperf if using an iterative SUNLinearSolver object */
  IDA_mem->ida_lperf = (iterative) ? idaLsPerf : NULL;

  /* Allocate memory for IDALsMemRec */
  idals_mem = NULL;
  idals_mem = (IDALsMem)malloc(sizeof(struct IDALsMemRec));
  if (idals_mem == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_LS_MEM_FAIL);
    return (IDALS_MEM_FAIL);
  }
  memset(idals_mem, 0, sizeof(struct IDALsMemRec));

  /* set SUNLinearSolver pointer */
  idals_mem->LS = LS;

  /* Linear solver type information */
  idals_mem->iterative   = iterative;
  idals_mem->matrixbased = matrixbased;

  /* Set defaults for Jacobian-related fields */
  idals_mem->J = A;
  if (A != NULL)
  {
    idals_mem->jacDQ  = SUNTRUE;
    idals_mem->jac    = idaLsDQJac;
    idals_mem->J_data = IDA_mem;
  }
  else
  {
    idals_mem->jacDQ  = SUNFALSE;
    idals_mem->jac    = NULL;
    idals_mem->J_data = NULL;
  }
  idals_mem->jtimesDQ = SUNTRUE;
  idals_mem->jtsetup  = NULL;
  idals_mem->jtimes   = idaLsDQJtimes;
  idals_mem->jt_res   = IDA_mem->ida_res;
  idals_mem->jt_data  = IDA_mem;

  /* Set defaults for preconditioner-related fields */
  idals_mem->pset   = NULL;
  idals_mem->psolve = NULL;
  idals_mem->pfree  = NULL;
  idals_mem->pdata  = IDA_mem->ida_user_data;

  /* Initialize counters */
  idaLsInitializeCounters(idals_mem);

  /* Set default values for the rest of the Ls parameters */
  idals_mem->eplifac   = PT05;
  idals_mem->dqincfac  = ONE;
  idals_mem->last_flag = IDALS_SUCCESS;

  /* If LS supports ATimes, attach IDALs routine */
  if (LS->ops->setatimes)
  {
    retval = SUNLinSolSetATimes(LS, IDA_mem, idaLsATimes);
    if (retval != SUN_SUCCESS)
    {
      IDAProcessError(IDA_mem, IDALS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                      "Error in calling SUNLinSolSetATimes");
      free(idals_mem);
      idals_mem = NULL;
      return (IDALS_SUNLS_FAIL);
    }
  }

  /* If LS supports preconditioning, initialize pset/psol to NULL */
  if (LS->ops->setpreconditioner)
  {
    retval = SUNLinSolSetPreconditioner(LS, IDA_mem, NULL, NULL);
    if (retval != SUN_SUCCESS)
    {
      IDAProcessError(IDA_mem, IDALS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                      "Error in calling SUNLinSolSetPreconditioner");
      free(idals_mem);
      idals_mem = NULL;
      return (IDALS_SUNLS_FAIL);
    }
  }

  /* Allocate memory for ytemp, yptemp and x */
  idals_mem->ytemp = N_VClone(IDA_mem->ida_tempv1);
  if (idals_mem->ytemp == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_LS_MEM_FAIL);
    free(idals_mem);
    idals_mem = NULL;
    return (IDALS_MEM_FAIL);
  }

  idals_mem->yptemp = N_VClone(IDA_mem->ida_tempv1);
  if (idals_mem->yptemp == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_LS_MEM_FAIL);
    N_VDestroy(idals_mem->ytemp);
    free(idals_mem);
    idals_mem = NULL;
    return (IDALS_MEM_FAIL);
  }

  idals_mem->x = N_VClone(IDA_mem->ida_tempv1);
  if (idals_mem->x == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_LS_MEM_FAIL);
    N_VDestroy(idals_mem->ytemp);
    N_VDestroy(idals_mem->yptemp);
    free(idals_mem);
    idals_mem = NULL;
    return (IDALS_MEM_FAIL);
  }

  /* For iterative LS, compute sqrtN */
  if (iterative)
  {
    idals_mem->nrmfac = SUNRsqrt(N_VGetLength(idals_mem->ytemp));
  }

  /* For matrix-based LS, enable solution scaling */
  if (matrixbased) { idals_mem->scalesol = SUNTRUE; }
  else { idals_mem->scalesol = SUNFALSE; }

  /* Attach linear solver memory to integrator memory */
  IDA_mem->ida_lmem = idals_mem;

  return (IDALS_SUCCESS);
}